

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O2

SPxId __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterHyperCoDim
          (SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *feastol)

{
  DIdxSet *this_00;
  uint *puVar1;
  int iVar2;
  int iVar3;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar4;
  pointer pnVar5;
  undefined8 uVar6;
  int *piVar7;
  type_conflict5 tVar8;
  DataKey DVar9;
  ulong uVar10;
  ulong uVar11;
  SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar12;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2a8;
  int local_26c;
  SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_268;
  ulong local_260;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_258;
  pointer local_250;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  devexpr local_128 [8];
  uint auStack_120 [2];
  uint local_118 [2];
  undefined8 uStack_110;
  undefined8 local_108;
  int local_100;
  undefined1 local_fc;
  fpclass_type local_f8;
  int32_t iStack_f4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  devexpr local_68 [8];
  uint auStack_60 [2];
  uint local_58 [2];
  undefined8 uStack_50;
  undefined8 local_48;
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  pSVar4 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar5 = (pSVar4->theTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_250 = (pSVar4->weights).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_258 = best;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&local_1e8,-1,(type *)0x0);
  local_2a8.m_backend.fpclass = cpp_dec_float_finite;
  local_2a8.m_backend.prec_elem = 10;
  local_2a8.m_backend.data._M_elems[0] = 0;
  local_2a8.m_backend.data._M_elems[1] = 0;
  local_2a8.m_backend.data._M_elems[2] = 0;
  local_2a8.m_backend.data._M_elems[3] = 0;
  local_2a8.m_backend.data._M_elems[4] = 0;
  local_2a8.m_backend.data._M_elems[5] = 0;
  local_2a8.m_backend.data._M_elems._24_5_ = 0;
  local_2a8.m_backend.data._M_elems[7]._1_3_ = 0;
  local_2a8.m_backend.data._M_elems._32_5_ = 0;
  local_2a8.m_backend.data._M_elems[9]._1_3_ = 0;
  local_2a8.m_backend.exp = 0;
  local_2a8.m_backend.neg = false;
  uVar11 = (ulong)(uint)(this->bestPricesCo).super_IdxSet.num;
  local_26c = -1;
  local_268 = this;
LAB_00232c23:
  uVar10 = uVar11 & 0xffffffff;
  while( true ) {
    uVar11 = uVar11 - 1;
    if ((int)uVar10 < 1) {
      this_00 = &local_268->bestPricesCo;
      uVar11 = (ulong)(uint)(((local_268->
                              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).thesolver)->updateViolsCo).super_IdxSet.num;
      pSVar12 = local_268;
      goto LAB_00232f75;
    }
    iVar2 = (local_268->bestPricesCo).super_IdxSet.idx[uVar11];
    local_260 = CONCAT44(local_260._4_4_,iVar2);
    uVar6 = *(undefined8 *)((long)&pnVar5[iVar2].m_backend.data + 0x20);
    local_2a8.m_backend.data._M_elems._32_5_ = SUB85(uVar6,0);
    local_2a8.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
    local_2a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar5[iVar2].m_backend.data;
    local_2a8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((long)&pnVar5[iVar2].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar5[iVar2].m_backend.data + 0x10);
    local_2a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    uVar6 = *(undefined8 *)(puVar1 + 2);
    local_2a8.m_backend.data._M_elems._24_5_ = SUB85(uVar6,0);
    local_2a8.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
    local_2a8.m_backend.exp = pnVar5[iVar2].m_backend.exp;
    local_2a8.m_backend.neg = pnVar5[iVar2].m_backend.neg;
    local_2a8.m_backend.fpclass = pnVar5[iVar2].m_backend.fpclass;
    local_2a8.m_backend.prec_elem = pnVar5[iVar2].m_backend.prec_elem;
    result.m_backend.data._M_elems._32_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
    result.m_backend.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
    result.m_backend.data._M_elems._8_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
    result.m_backend.data._M_elems._16_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
    result.m_backend.data._M_elems._24_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
    result.m_backend.exp = (feastol->m_backend).exp;
    result.m_backend.neg = (feastol->m_backend).neg;
    result.m_backend.fpclass = (feastol->m_backend).fpclass;
    result.m_backend.prec_elem = (feastol->m_backend).prec_elem;
    if (result.m_backend.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0)
    {
      result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
    }
    pSVar12 = local_268;
    tVar8 = boost::multiprecision::operator<(&local_2a8,&result);
    if (tVar8) break;
    piVar7 = (local_268->bestPricesCo).super_IdxSet.idx;
    iVar3 = (local_268->bestPricesCo).super_IdxSet.num;
    (local_268->bestPricesCo).super_IdxSet.num = iVar3 + -1;
    piVar7[uVar11] = piVar7[(long)iVar3 + -1];
    (((local_268->
      super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thesolver)->isInfeasibleCo).data[iVar2] = 0;
    uVar10 = (ulong)((int)uVar10 - 1);
  }
  uStack_50 = CONCAT35(local_2a8.m_backend.data._M_elems[7]._1_3_,
                       local_2a8.m_backend.data._M_elems._24_5_);
  local_68 = (devexpr  [8])local_2a8.m_backend.data._M_elems._0_8_;
  auStack_60[0] = local_2a8.m_backend.data._M_elems[2];
  auStack_60[1] = local_2a8.m_backend.data._M_elems[3];
  local_58[0] = local_2a8.m_backend.data._M_elems[4];
  local_58[1] = local_2a8.m_backend.data._M_elems[5];
  local_48 = CONCAT35(local_2a8.m_backend.data._M_elems[9]._1_3_,
                      local_2a8.m_backend.data._M_elems._32_5_);
  local_40 = local_2a8.m_backend.exp;
  local_3c = local_2a8.m_backend.neg;
  local_38 = local_2a8.m_backend.fpclass;
  iStack_34 = local_2a8.m_backend.prec_elem;
  local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&local_250[iVar2].m_backend.data;
  local_a8.m_backend.data._M_elems._8_8_ =
       *(undefined8 *)((long)&local_250[iVar2].m_backend.data + 8);
  puVar1 = (uint *)((long)&local_250[iVar2].m_backend.data + 0x10);
  local_a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  local_a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
  local_a8.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)((long)&local_250[iVar2].m_backend.data + 0x20);
  local_a8.m_backend.exp = local_250[iVar2].m_backend.exp;
  local_a8.m_backend.neg = local_250[iVar2].m_backend.neg;
  local_a8.m_backend.fpclass = local_250[iVar2].m_backend.fpclass;
  local_a8.m_backend.prec_elem = local_250[iVar2].m_backend.prec_elem;
  local_e8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
  local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
  local_e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
  local_e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
  local_e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
  local_e8.m_backend.exp = (feastol->m_backend).exp;
  local_e8.m_backend.neg = (feastol->m_backend).neg;
  local_e8.m_backend.fpclass = (feastol->m_backend).fpclass;
  local_e8.m_backend.prec_elem = (feastol->m_backend).prec_elem;
  devexpr::
  computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&result,local_68,&local_a8,&local_e8,
             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)pSVar12);
  local_2a8.m_backend.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
  local_2a8.m_backend.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
  local_2a8.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
  local_2a8.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
  local_2a8.m_backend.data._M_elems._24_5_ = result.m_backend.data._M_elems._24_5_;
  local_2a8.m_backend.data._M_elems[7]._1_3_ = result.m_backend.data._M_elems[7]._1_3_;
  local_2a8.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
  local_2a8.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
  local_2a8.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
  local_2a8.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
  local_2a8.m_backend.exp = result.m_backend.exp;
  local_2a8.m_backend.neg = result.m_backend.neg;
  local_2a8.m_backend.fpclass = result.m_backend.fpclass;
  local_2a8.m_backend.prec_elem = result.m_backend.prec_elem;
  tVar8 = boost::multiprecision::operator>(&local_2a8,local_258);
  if (tVar8) {
    *(ulong *)((local_258->m_backend).data._M_elems + 8) =
         CONCAT35(local_2a8.m_backend.data._M_elems[9]._1_3_,
                  local_2a8.m_backend.data._M_elems._32_5_);
    *(undefined8 *)((local_258->m_backend).data._M_elems + 4) =
         local_2a8.m_backend.data._M_elems._16_8_;
    *(ulong *)((local_258->m_backend).data._M_elems + 6) =
         CONCAT35(local_2a8.m_backend.data._M_elems[7]._1_3_,
                  local_2a8.m_backend.data._M_elems._24_5_);
    *(undefined8 *)(local_258->m_backend).data._M_elems = local_2a8.m_backend.data._M_elems._0_8_;
    *(undefined8 *)((local_258->m_backend).data._M_elems + 2) =
         local_2a8.m_backend.data._M_elems._8_8_;
    (local_258->m_backend).exp = local_2a8.m_backend.exp;
    (local_258->m_backend).neg = local_2a8.m_backend.neg;
    (local_258->m_backend).fpclass = local_2a8.m_backend.fpclass;
    (local_258->m_backend).prec_elem = local_2a8.m_backend.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&(this->last).m_backend,&local_250[iVar2].m_backend);
    local_26c = (int)local_260;
  }
  tVar8 = boost::multiprecision::operator<
                    (&local_2a8,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_1e8);
  if (!tVar8) goto LAB_00232ee7;
  goto LAB_00232f06;
LAB_00232f75:
  uVar10 = uVar11 & 0xffffffff;
  do {
    uVar11 = uVar11 - 1;
    if ((int)uVar10 < 1) {
      if (local_26c < 0) {
        DVar9.info = 0;
        DVar9.idx = -1;
      }
      else {
        DVar9 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ::id((pSVar12->
                              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).thesolver,local_26c);
      }
      return (SPxId)DVar9;
    }
    pSVar4 = (pSVar12->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    iVar2 = (pSVar4->updateViolsCo).super_IdxSet.idx[uVar11];
    if ((pSVar4->isInfeasibleCo).data[iVar2] == 1) {
      uVar6 = *(undefined8 *)((long)&pnVar5[iVar2].m_backend.data + 0x20);
      local_2a8.m_backend.data._M_elems._32_5_ = SUB85(uVar6,0);
      local_2a8.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
      local_2a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar5[iVar2].m_backend.data;
      local_2a8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((long)&pnVar5[iVar2].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[iVar2].m_backend.data + 0x10);
      local_2a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar6 = *(undefined8 *)(puVar1 + 2);
      local_2a8.m_backend.data._M_elems._24_5_ = SUB85(uVar6,0);
      local_2a8.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
      local_2a8.m_backend.exp = pnVar5[iVar2].m_backend.exp;
      local_2a8.m_backend.neg = pnVar5[iVar2].m_backend.neg;
      local_2a8.m_backend.fpclass = pnVar5[iVar2].m_backend.fpclass;
      local_2a8.m_backend.prec_elem = pnVar5[iVar2].m_backend.prec_elem;
      result.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
      result.m_backend.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
      result.m_backend.data._M_elems._8_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 2)
      ;
      result.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
      result.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
      result.m_backend.exp = (feastol->m_backend).exp;
      result.m_backend.neg = (feastol->m_backend).neg;
      result.m_backend.fpclass = (feastol->m_backend).fpclass;
      result.m_backend.prec_elem = (feastol->m_backend).prec_elem;
      if (result.m_backend.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0
         ) {
        result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
      }
      local_260 = uVar11;
      tVar8 = boost::multiprecision::operator<(&local_2a8,&result);
      if (tVar8) {
        uStack_110 = CONCAT35(local_2a8.m_backend.data._M_elems[7]._1_3_,
                              local_2a8.m_backend.data._M_elems._24_5_);
        local_128 = (devexpr  [8])local_2a8.m_backend.data._M_elems._0_8_;
        auStack_120[0] = local_2a8.m_backend.data._M_elems[2];
        auStack_120[1] = local_2a8.m_backend.data._M_elems[3];
        local_118[0] = local_2a8.m_backend.data._M_elems[4];
        local_118[1] = local_2a8.m_backend.data._M_elems[5];
        local_108 = CONCAT35(local_2a8.m_backend.data._M_elems[9]._1_3_,
                             local_2a8.m_backend.data._M_elems._32_5_);
        local_100 = local_2a8.m_backend.exp;
        local_fc = local_2a8.m_backend.neg;
        local_f8 = local_2a8.m_backend.fpclass;
        iStack_f4 = local_2a8.m_backend.prec_elem;
        local_168.m_backend.data._M_elems._0_8_ = *(undefined8 *)&local_250[iVar2].m_backend.data;
        local_168.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((long)&local_250[iVar2].m_backend.data + 8);
        puVar1 = (uint *)((long)&local_250[iVar2].m_backend.data + 0x10);
        local_168.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_168.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        local_168.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((long)&local_250[iVar2].m_backend.data + 0x20);
        local_168.m_backend.exp = local_250[iVar2].m_backend.exp;
        local_168.m_backend.neg = local_250[iVar2].m_backend.neg;
        local_168.m_backend.fpclass = local_250[iVar2].m_backend.fpclass;
        local_168.m_backend.prec_elem = local_250[iVar2].m_backend.prec_elem;
        local_1a8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
        local_1a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
        local_1a8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
        local_1a8.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
        local_1a8.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
        local_1a8.m_backend.exp = (feastol->m_backend).exp;
        local_1a8.m_backend.neg = (feastol->m_backend).neg;
        local_1a8.m_backend.fpclass = (feastol->m_backend).fpclass;
        local_1a8.m_backend.prec_elem = (feastol->m_backend).prec_elem;
        devexpr::
        computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&result,local_128,&local_168,&local_1a8,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)pSVar12);
        local_2a8.m_backend.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
        local_2a8.m_backend.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
        local_2a8.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
        local_2a8.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
        local_2a8.m_backend.data._M_elems._24_5_ = result.m_backend.data._M_elems._24_5_;
        local_2a8.m_backend.data._M_elems[7]._1_3_ = result.m_backend.data._M_elems[7]._1_3_;
        local_2a8.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
        local_2a8.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
        local_2a8.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
        local_2a8.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
        local_2a8.m_backend.exp = result.m_backend.exp;
        local_2a8.m_backend.neg = result.m_backend.neg;
        local_2a8.m_backend.fpclass = result.m_backend.fpclass;
        local_2a8.m_backend.prec_elem = result.m_backend.prec_elem;
        tVar8 = boost::multiprecision::operator>
                          (&local_2a8,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_1e8);
        uVar11 = local_260;
        pSVar12 = local_268;
        if (tVar8) break;
      }
      else {
        (((local_268->
          super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thesolver)->isInfeasibleCo).data[iVar2] = 0;
        uVar11 = local_260;
        pSVar12 = local_268;
      }
    }
    uVar10 = (ulong)((int)uVar10 - 1);
  } while( true );
  tVar8 = boost::multiprecision::operator>(&local_2a8,local_258);
  if (tVar8) {
    *(ulong *)((local_258->m_backend).data._M_elems + 8) =
         CONCAT35(local_2a8.m_backend.data._M_elems[9]._1_3_,
                  local_2a8.m_backend.data._M_elems._32_5_);
    *(undefined8 *)((local_258->m_backend).data._M_elems + 4) =
         local_2a8.m_backend.data._M_elems._16_8_;
    *(ulong *)((local_258->m_backend).data._M_elems + 6) =
         CONCAT35(local_2a8.m_backend.data._M_elems[7]._1_3_,
                  local_2a8.m_backend.data._M_elems._24_5_);
    *(undefined8 *)(local_258->m_backend).data._M_elems = local_2a8.m_backend.data._M_elems._0_8_;
    *(undefined8 *)((local_258->m_backend).data._M_elems + 2) =
         local_2a8.m_backend.data._M_elems._8_8_;
    (local_258->m_backend).exp = local_2a8.m_backend.exp;
    (local_258->m_backend).neg = local_2a8.m_backend.neg;
    (local_258->m_backend).fpclass = local_2a8.m_backend.fpclass;
    (local_258->m_backend).prec_elem = local_2a8.m_backend.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&(this->last).m_backend,&local_250[iVar2].m_backend);
    local_26c = iVar2;
  }
  pSVar12 = local_268;
  (((local_268->
    super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).thesolver)->isInfeasibleCo).data[iVar2] = 2;
  DIdxSet::addIdx(this_00,iVar2);
  uVar11 = local_260;
  goto LAB_00232f75;
LAB_00232ee7:
  result.m_backend.data._M_elems._0_8_ = result.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
  tVar8 = boost::multiprecision::operator<
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_1e8,(int *)&result);
  if (tVar8) {
LAB_00232f06:
    local_1e8.data._M_elems[9]._1_3_ = local_2a8.m_backend.data._M_elems[9]._1_3_;
    local_1e8.data._M_elems._32_5_ = local_2a8.m_backend.data._M_elems._32_5_;
    local_1e8.data._M_elems[0] = local_2a8.m_backend.data._M_elems[0];
    local_1e8.data._M_elems[1] = local_2a8.m_backend.data._M_elems[1];
    local_1e8.data._M_elems[2] = local_2a8.m_backend.data._M_elems[2];
    local_1e8.data._M_elems[3] = local_2a8.m_backend.data._M_elems[3];
    local_1e8.data._M_elems[4] = local_2a8.m_backend.data._M_elems[4];
    local_1e8.data._M_elems[5] = local_2a8.m_backend.data._M_elems[5];
    local_1e8.data._M_elems[7]._1_3_ = local_2a8.m_backend.data._M_elems[7]._1_3_;
    local_1e8.data._M_elems._24_5_ = local_2a8.m_backend.data._M_elems._24_5_;
    local_1e8.exp = local_2a8.m_backend.exp;
    local_1e8.neg = local_2a8.m_backend.neg;
    local_1e8.fpclass = local_2a8.m_backend.fpclass;
    local_1e8.prec_elem = local_2a8.m_backend.prec_elem;
  }
  goto LAB_00232c23;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnterHyperCoDim(R& best, R feastol)
{
   const R* test = this->thesolver->test().get_const_ptr();
   const R* pen = this->thesolver->weights.get_const_ptr();
   R leastBest = -1;
   R x;
   int enterIdx = -1;
   int idx;

   // find the best price from short candidate list
   for(int i = bestPricesCo.size() - 1; i >= 0; --i)
   {
      idx = bestPricesCo.index(i);
      x = test[idx];

      if(x < -feastol)
      {
         x = devexpr::computePrice(x, pen[idx], feastol);

         assert(x >= 0);

         // update the best price of candidate list
         if(x > best)
         {
            best = x;
            enterIdx = idx;
            last = pen[idx];
         }

         // update the smallest price of candidate list
         if(x < leastBest || leastBest < 0)
            leastBest = x;
      }
      else
      {
         bestPricesCo.remove(i);
         this->thesolver->isInfeasibleCo[idx] = this->NOT_VIOLATED;
      }
   }

   //scan the updated indeces for a better price
   for(int i = this->thesolver->updateViolsCo.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->updateViolsCo.index(i);

      // only look at indeces that were not checked already
      if(this->thesolver->isInfeasibleCo[idx] == this->VIOLATED)
      {
         x = test[idx];

         if(x < -feastol)
         {
            x = devexpr::computePrice(x, pen[idx], feastol);

            if(x > leastBest)
            {
               if(x > best)
               {
                  best = x;
                  enterIdx = idx;
                  last = pen[idx];
               }

               // put index into candidate list
               this->thesolver->isInfeasibleCo[idx] = this->VIOLATED_AND_CHECKED;
               bestPricesCo.addIdx(idx);
            }
         }
         else
         {
            this->thesolver->isInfeasibleCo[idx] = this->NOT_VIOLATED;
         }
      }
   }

   if(enterIdx >= 0)
      return this->thesolver->id(enterIdx);
   else
      return SPxId();
}